

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_policy_traits.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     common_policy_traits<absl::lts_20250127::container_internal::set_slot_policy<google::protobuf::Edition>,void>
     ::transfer_impl<std::allocator<google::protobuf::Edition>,void>
               (undefined8 param_1,remove_const_t<slot_type>_conflict29 *new_slot,
               remove_const_t<slot_type>_conflict29 *old_slot)

{
  value_type *pvVar1;
  Edition *pEVar2;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<google::protobuf::Edition> *param_0_local;
  
  pvVar1 = element<absl::lts_20250127::container_internal::set_slot_policy<google::protobuf::Edition>>
                     (new_slot);
  pEVar2 = std::launder<google::protobuf::Edition>(pvVar1);
  pvVar1 = element<absl::lts_20250127::container_internal::set_slot_policy<google::protobuf::Edition>>
                     (old_slot);
  *pEVar2 = *pvVar1;
  return;
}

Assistant:

static std::true_type transfer_impl(Alloc*, slot_type* new_slot,
                                      slot_type* old_slot, Rank1) {
    // TODO(b/247130232): remove casts after fixing warnings.
    // TODO(b/251814870): remove casts after fixing warnings.
    std::memcpy(
        static_cast<void*>(std::launder(
            const_cast<std::remove_const_t<value_type>*>(&element(new_slot)))),
        static_cast<const void*>(&element(old_slot)), sizeof(value_type));
    return {};
  }